

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceFile * __thiscall cmMakefile::LinearGetSourceFileWithOutput(cmMakefile *this,string *name)

{
  cmCustomCommand *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  long lVar3;
  pointer pbVar4;
  cmSourceFile *pcVar5;
  pointer ppcVar6;
  string out;
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  ppcVar6 = (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar6 ==
        (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pcVar5 = (cmSourceFile *)0x0;
LAB_0029513e:
      std::__cxx11::string::~string((string *)&out);
      return pcVar5;
    }
    pcVar1 = cmSourceFile::GetCustomCommand(*ppcVar6);
    if (pcVar1 != (cmCustomCommand *)0x0) {
      pcVar1 = cmSourceFile::GetCustomCommand(*ppcVar6);
      pvVar2 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar1);
      for (pbVar4 = (pvVar2->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar4 != (pvVar2->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
        std::__cxx11::string::_M_assign((string *)&out);
        lVar3 = std::__cxx11::string::rfind((string *)&out,(ulong)name);
        if (((lVar3 != -1) && (lVar3 == out._M_string_length - name->_M_string_length)) &&
           ((lVar3 == 0 || (out._M_dataplus._M_p[lVar3 + -1] == '/')))) {
          pcVar5 = *ppcVar6;
          goto LAB_0029513e;
        }
      }
    }
    ppcVar6 = ppcVar6 + 1;
  } while( true );
}

Assistant:

cmSourceFile*
cmMakefile::LinearGetSourceFileWithOutput(const std::string& name) const
{
  std::string out;

  // look through all the source files that have custom commands
  // and see if the custom command has the passed source file as an output
  for(std::vector<cmSourceFile*>::const_iterator i =
        this->SourceFiles.begin(); i != this->SourceFiles.end(); ++i)
    {
    // does this source file have a custom command?
    if ((*i)->GetCustomCommand())
      {
      // Does the output of the custom command match the source file name?
      const std::vector<std::string>& outputs =
        (*i)->GetCustomCommand()->GetOutputs();
      for(std::vector<std::string>::const_iterator o = outputs.begin();
          o != outputs.end(); ++o)
        {
        out = *o;
        std::string::size_type pos = out.rfind(name);
        // If the output matches exactly
        if (pos != out.npos &&
            pos == out.size() - name.size() &&
            (pos ==0 || out[pos-1] == '/'))
          {
          return *i;
          }
        }
      }
    }

  // otherwise return NULL
  return 0;
}